

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveTopologyTest::createBufferData
          (PrimitiveTopologyTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000014;
  uint uVar3;
  bool bVar4;
  int vertexNdx;
  int iVar5;
  int vertexNdx_1;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  float local_114;
  ulong local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  value_type local_e8;
  undefined1 local_c8 [28];
  float local_ac;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_a8;
  undefined1 local_88 [28];
  float local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *local_60;
  value_type local_58;
  
  local_110 = CONCAT44(in_register_00000014,primitiveCount);
  local_58.position.m_data[0] = -1.0;
  local_58.position.m_data[1] = -1.0;
  local_58.position.m_data[2] = 0.0;
  local_58.position.m_data[3] = 1.0;
  local_58.color.m_data[0] = 0.0;
  local_58.color.m_data[1] = 1.0;
  local_58.color.m_data[2] = 0.0;
  local_58.color.m_data[3] = 1.0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_a8.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = indexData;
  local_60 = vertexData;
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    if (0 < primitiveCount) {
      local_c8._0_4_ =
           1.6 / (float)(~((int)(((uint)(local_110 >> 0x1f) & 1) + primitiveCount) >> 1) +
                        primitiveCount);
      fVar9 = 0.0;
      do {
        local_e8.position.m_data[0] = (float)((uint)fVar9 >> 1) * (float)local_c8._0_4_ + -0.8;
        local_e8.position.m_data[1] = (float)((uint)fVar9 & 1) * 1.6 + -0.8;
        local_e8.position.m_data[2] = 0.0;
        local_e8.position.m_data[3] = 1.0;
        local_e8.color.m_data[0] = 1.0;
        local_e8.color.m_data[1] = 0.0;
        local_e8.color.m_data[2] = 0.0;
        local_e8.color.m_data[3] = 1.0;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&local_a8,&local_e8);
        local_114 = fVar9;
        if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
        }
        else {
          *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)fVar9;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        fVar9 = (float)((int)fVar9 + 1);
      } while ((float)local_110 != fVar9);
    }
    goto switchD_004f0993_default;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    iVar2 = primitiveCount + -1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    iVar2 = (int)(((uint)(local_110 >> 0x1f) & 1) + primitiveCount) >> 1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    uVar1 = ((uint)(local_110 >> 0x1f) & 1) + primitiveCount;
    iVar2 = ((((int)uVar1 >> 1) + primitiveCount * 2) - (uVar1 & 0xfffffffe)) + -1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    iVar2 = primitiveCount - ((int)(((uint)(local_110 >> 0x1f) & 1) + primitiveCount) >> 1);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    local_c8._0_12_ = ZEXT812(0x3f4ccccd);
    local_c8._12_4_ = 0;
    local_ac = 0.8;
    goto LAB_004f0b98;
  default:
    local_c8._0_16_ = ZEXT816(0);
    goto LAB_004f097a;
  }
  local_c8._0_16_ = ZEXT416((uint)(1.6 / (float)iVar2));
LAB_004f097a:
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
    if (0 < primitiveCount) {
      iVar2 = 0;
      do {
        uVar1 = 0;
        bVar8 = true;
        do {
          bVar4 = bVar8;
          fVar9 = (float)(uVar1 | iVar2 * 2);
          local_e8.position.m_data[0] = (float)((int)fVar9 / 2) * (float)local_c8._0_4_ + -0.8;
          local_e8.position.m_data[1] = (float)uVar1 * 1.6 + -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = fVar9;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar9;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar1 = 1;
          bVar8 = false;
        } while (bVar4);
        iVar2 = iVar2 + 1;
      } while ((float)iVar2 != (float)local_110);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    if (0 < primitiveCount) {
      local_110 = (ulong)(uint)-primitiveCount;
      fVar9 = 1.4013e-45;
      do {
        if (fVar9 == 1.4013e-45) {
          local_e8.position.m_data[0] = -0.8;
          local_e8.position.m_data[1] = -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = 0.0;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_e8.position.m_data[0] = -0.8;
          local_e8.position.m_data[1] = 0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = 1.4013e-45;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 1;
LAB_004f12e0:
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_e8.position.m_data[0] = (float)((uint)fVar9 >> 1) * (float)local_c8._0_4_ + -0.8;
          local_e8.position.m_data[1] = (float)((uint)fVar9 & 1) * 1.6 + -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = fVar9;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar9;
            goto LAB_004f12e0;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
        }
        iVar2 = (int)local_110 + (int)fVar9;
        fVar9 = (float)((int)fVar9 + 1);
      } while (iVar2 != 0);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    if (0 < primitiveCount) {
      local_c8._4_4_ = 0x3fcccccd;
      local_c8._8_8_ = 0;
      iVar2 = 0;
      iVar6 = 0;
      do {
        iVar5 = 0;
        do {
          fVar9 = (float)(iVar2 + iVar5);
          local_e8.position.m_data[0] = (float)((int)fVar9 / 2) * (float)local_c8._0_4_ + -0.8;
          local_e8.position.m_data[1] = (float)((int)fVar9 % 2) * (float)local_c8._4_4_ + -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = fVar9;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar9;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != 3);
        iVar6 = iVar6 + 1;
        iVar2 = iVar2 + 3;
      } while ((float)iVar6 != (float)local_110);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    if (0 < primitiveCount) {
      local_88._4_4_ = 0x3fcccccd;
      local_88._0_4_ = local_c8._0_4_;
      local_88._8_8_ = 0;
      iVar2 = 0;
      do {
        if (iVar2 == 0) {
          uVar7 = 0;
          do {
            fVar9 = (float)uVar7;
            local_e8.position.m_data[0] = (float)(int)(uVar7 >> 1) * (float)local_c8._0_4_ + -0.8;
            local_e8.position.m_data[1] = (float)((uint)fVar9 & 1) * 1.6 + -0.8;
            local_e8.position.m_data[2] = 0.0;
            local_e8.position.m_data[3] = 1.0;
            local_e8.color.m_data[0] = 1.0;
            local_e8.color.m_data[1] = 0.0;
            local_e8.color.m_data[2] = 0.0;
            local_e8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_a8,&local_e8);
            local_114 = fVar9;
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)fVar9;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            uVar7 = (ulong)((int)fVar9 + 1U);
          } while ((int)fVar9 + 1U != 3);
        }
        else {
          fVar9 = (float)(iVar2 + 2);
          uVar1 = (iVar2 - ((int)fVar9 >> 0x1f)) + 2;
          local_e8.position.m_data[0] = (float)((int)uVar1 >> 1) * (float)local_88._0_4_ + -0.8;
          local_e8.position.m_data[1] =
               (float)(int)((int)fVar9 - (uVar1 & 0xfffffffe)) * (float)local_88._4_4_ + -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = fVar9;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar9;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        iVar2 = iVar2 + 1;
      } while ((float)iVar2 != (float)local_110);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    local_ac = 1.6;
LAB_004f0b98:
    if (0 < primitiveCount) {
      fVar9 = 1.5707964;
      if (6.2831855 / (float)primitiveCount <= 1.5707964) {
        fVar9 = 6.2831855 / (float)primitiveCount;
      }
      local_88._0_4_ = fVar9;
      iVar2 = 1;
      do {
        if (iVar2 == 1) {
          local_e8.position.m_data[0] = 0.0;
          local_e8.position.m_data[1] = 0.0;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = 0.0;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_e8.position.m_data[0] = (float)local_c8._0_4_;
          local_e8.position.m_data[1] = 0.0;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = 1.4013e-45;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 1;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          fVar9 = cosf((float)local_88._0_4_);
          local_110 = CONCAT44(local_110._4_4_,fVar9);
          local_e8.position.m_data[1] = sinf((float)local_88._0_4_);
          local_e8.position.m_data[0] = (float)local_110 * (float)local_c8._0_4_;
          local_e8.position.m_data[1] = local_e8.position.m_data[1] * local_ac;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = 2.8026e-45;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 2;
LAB_004f0db9:
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_6c = (float)iVar2 * (float)local_88._0_4_;
          fVar9 = cosf(local_6c);
          local_110 = CONCAT44(local_110._4_4_,fVar9);
          local_e8.position.m_data[1] = sinf(local_6c);
          local_e8.position.m_data[0] = (float)local_110 * (float)local_c8._0_4_;
          local_e8.position.m_data[1] = local_e8.position.m_data[1] * local_ac;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = (float)(iVar2 + 1);
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_114;
            goto LAB_004f0db9;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
        }
        bVar8 = iVar2 != primitiveCount;
        iVar2 = iVar2 + 1;
      } while (bVar8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_a8,&local_58);
    if (0 < (int)(float)local_110) {
      iVar2 = 0;
      do {
        local_e8.position.m_data[0] = 0.0;
        if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
        }
        else {
          *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 0;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar1 = 0;
        bVar8 = true;
        do {
          bVar4 = bVar8;
          uVar3 = uVar1 | iVar2 * 2;
          local_e8.position.m_data[0] = (float)((int)uVar3 / 2) * (float)local_c8._0_4_ + -0.8;
          local_e8.position.m_data[1] = (float)uVar1 * 1.6 + -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = (float)(uVar3 + 1);
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_114;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar1 = 1;
          bVar8 = false;
        } while (bVar4);
        local_e8.position.m_data[0] = 0.0;
        if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
        }
        else {
          *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 0;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar2 = iVar2 + 1;
      } while ((float)iVar2 != (float)local_110);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_a8,&local_58);
    local_e8.position.m_data[0] = 0.0;
    if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_e8);
    }
    else {
      *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    if (0 < (int)(float)local_110) {
      local_110 = (ulong)(uint)-(int)(float)local_110;
      uVar1 = 1;
      do {
        if (uVar1 == 1) {
          local_e8.position.m_data[0] = -0.8;
          local_e8.position.m_data[1] = -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = 1.4013e-45;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 1;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_e8.position.m_data[0] = -0.8;
          local_e8.position.m_data[1] = 0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = 2.8026e-45;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 2;
LAB_004f1815:
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_e8.position.m_data[0] = (float)(uVar1 >> 1) * (float)local_c8._0_4_ + -0.8;
          local_e8.position.m_data[1] = (float)(uVar1 & 1) * 1.6 + -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = (float)(uVar1 + 1);
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_114;
            goto LAB_004f1815;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
        }
        iVar2 = (int)local_110 + uVar1;
        uVar1 = uVar1 + 1;
      } while (iVar2 != 0);
    }
    local_e8.position.m_data[0] = 0.0;
    if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_e8);
    }
    else {
      *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_a8,&local_58);
    if (0 < (int)(float)local_110) {
      local_c8._4_4_ = 0x3fcccccd;
      local_c8._8_8_ = 0;
      iVar2 = 0;
      fVar9 = 1.4013e-45;
      do {
        local_88._0_4_ = iVar2;
        iVar2 = 3;
        local_ac = fVar9;
        do {
          uVar1 = ((int)fVar9 - ((int)((int)fVar9 - 1U) >> 0x1f)) - 1;
          local_e8.position.m_data[0] = (float)((int)uVar1 >> 1) * (float)local_c8._0_4_ + -0.8;
          local_e8.position.m_data[1] =
               (float)(int)(((int)fVar9 - 1U) - (uVar1 & 0xfffffffe)) * (float)local_c8._4_4_ + -0.8
          ;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_114 = fVar9;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar9;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_114 = 0.0;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          fVar9 = (float)((int)fVar9 + 1);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        iVar2 = local_88._0_4_ + 1;
        fVar9 = (float)((int)local_ac + 3);
      } while ((float)iVar2 != (float)local_110);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_a8,&local_58);
    if (0 < (int)(float)local_110) {
      local_88._4_4_ = 0x3fcccccd;
      local_88._0_4_ = local_c8._0_4_;
      local_88._8_8_ = 0;
      iVar2 = 0;
      do {
        if (iVar2 == 0) {
          fVar9 = 1.4013e-45;
          do {
            local_e8.position.m_data[0] =
                 (float)((int)fVar9 - 1U >> 1) * (float)local_c8._0_4_ + -0.8;
            local_e8.position.m_data[1] = (float)((int)fVar9 - 1U & 1) * 1.6 + -0.8;
            local_e8.position.m_data[2] = 0.0;
            local_e8.position.m_data[3] = 1.0;
            local_e8.color.m_data[0] = 1.0;
            local_e8.color.m_data[1] = 0.0;
            local_e8.color.m_data[2] = 0.0;
            local_e8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_a8,&local_e8);
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_114 = fVar9;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)fVar9;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_114 = 0.0;
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            fVar9 = (float)((int)fVar9 + 1);
          } while (fVar9 != 5.60519e-45);
        }
        else {
          uVar1 = (iVar2 - (iVar2 + 2 >> 0x1f)) + 2;
          local_e8.position.m_data[0] = (float)((int)uVar1 >> 1) * (float)local_88._0_4_ + -0.8;
          local_e8.position.m_data[1] =
               (float)(int)((iVar2 + 2) - (uVar1 & 0xfffffffe)) * (float)local_88._4_4_ + -0.8;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_a8,&local_e8);
          local_114 = (float)(iVar2 + 3);
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_114;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_114 = 0.0;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_114);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        iVar2 = iVar2 + 1;
      } while ((float)iVar2 != (float)local_110);
    }
  }
switchD_004f0993_default:
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (local_60,&local_a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_68,&local_108);
  if (local_a8.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrimitiveTopologyTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount + primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				const Vertex4RGBA vertex =
				{
					tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
					red
				};

				vertices.push_back(vertex);
				indices.push_back(primitiveNdx);
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((primitiveNdx * 2 + vertexNdx));
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(primitiveSizeX, 0.0f, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle), primitiveSizeY * deFloatSin(stepAngle), 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				indices.push_back(0);

				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 2 + vertexNdx + 1);
				}

				indices.push_back(0);
			}
			break;


		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);
			indices.push_back(0);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx + 1);
					indices.push_back(0);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx + 1);
						indices.push_back(0);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2 + 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}